

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int,int),BLOCK_SIZE,int>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::AdvanceIfEnd<2ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<int>::operator!=
                    ((ParamIterator<int> *)(this + 0x40),(ParamIterator<int> *)(this + 0x28));
  if (bVar1) {
    return;
  }
  ParamIterator<int>::operator=
            ((ParamIterator<int> *)(this + 0x40),(ParamIterator<int> *)(this + 0x10));
  (**(code **)(**(long **)(this + 0x48) + 0x18))();
  AdvanceIfEnd<1ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }